

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Mesh::keyframe(Mesh *this,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  mapped_type *pmVar4;
  double local_18;
  
  dVar2 = (this->super_SceneObject).position.x;
  dVar3 = (this->super_SceneObject).position.y;
  dVar1 = (this->super_SceneObject).position.z;
  local_18 = t;
  pmVar4 = std::
           map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
           ::operator[](&(this->super_SceneObject).positions.knots,&local_18);
  pmVar4->x = dVar2;
  pmVar4->y = dVar3;
  pmVar4->z = dVar1;
  dVar2 = (this->super_SceneObject).rotation.x;
  dVar3 = (this->super_SceneObject).rotation.y;
  dVar1 = (this->super_SceneObject).rotation.z;
  local_18 = t;
  pmVar4 = std::
           map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
           ::operator[](&(this->super_SceneObject).rotations.knots,&local_18);
  pmVar4->x = dVar2;
  pmVar4->y = dVar3;
  pmVar4->z = dVar1;
  dVar2 = (this->super_SceneObject).scale.x;
  dVar3 = (this->super_SceneObject).scale.y;
  dVar1 = (this->super_SceneObject).scale.z;
  local_18 = t;
  pmVar4 = std::
           map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
           ::operator[](&(this->super_SceneObject).scales.knots,&local_18);
  pmVar4->x = dVar2;
  pmVar4->y = dVar3;
  pmVar4->z = dVar1;
  if (this->skeleton != (Skeleton *)0x0) {
    Skeleton::keyframe(this->skeleton,t);
  }
  return;
}

Assistant:

void Mesh::keyframe(double t) {
  positions.setValue(t, position);
  rotations.setValue(t, rotation);
  scales.setValue(t, scale);
  if (skeleton) skeleton->keyframe(t);
}